

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

string * __thiscall
cmTarget::ImportedGetFullPath
          (string *__return_storage_ptr__,cmTarget *this,string *config,ArtifactType artifact)

{
  bool bVar1;
  TargetType TVar2;
  ulong uVar3;
  char *pcVar4;
  string *psVar5;
  allocator local_141;
  string local_140;
  char *local_120;
  char *implib;
  char *config_implib;
  undefined1 local_108 [8];
  string impProp_1;
  string local_e0;
  char *local_c0;
  char *location;
  char *config_location;
  undefined1 local_a8 [8];
  string impProp;
  string suffix;
  char *imp;
  char *loc;
  undefined1 local_48 [8];
  string desired_config;
  ArtifactType artifact_local;
  string *config_local;
  cmTarget *this_local;
  string *result;
  
  desired_config.field_2._12_4_ = artifact;
  bVar1 = IsImported(this);
  if (bVar1) {
    std::__cxx11::string::string((string *)local_48,(string *)config);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_48,"NOCONFIG");
    }
    loc._3_1_ = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    imp = (char *)0x0;
    suffix.field_2._8_8_ = 0;
    std::__cxx11::string::string((string *)(impProp.field_2._M_local_buf + 8));
    TVar2 = GetType(this);
    if ((TVar2 != INTERFACE_LIBRARY) &&
       (bVar1 = GetMappedConfig(this,(string *)local_48,&imp,(char **)((long)&suffix.field_2 + 8),
                                (string *)((long)&impProp.field_2 + 8)), bVar1)) {
      if (desired_config.field_2._12_4_ == 0) {
        if (imp == (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_a8,"IMPORTED_LOCATION",
                     (allocator *)((long)&config_location + 7));
          std::allocator<char>::~allocator((allocator<char> *)((long)&config_location + 7));
          std::__cxx11::string::operator+=
                    ((string *)local_a8,(string *)(impProp.field_2._M_local_buf + 8));
          location = GetProperty(this,(string *)local_a8);
          if (location == (char *)0x0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_e0,"IMPORTED_LOCATION",
                       (allocator *)(impProp_1.field_2._M_local_buf + 0xf));
            pcVar4 = GetProperty(this,&local_e0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(impProp_1.field_2._M_local_buf + 0xf));
            local_c0 = pcVar4;
            if (pcVar4 != (char *)0x0) {
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar4);
            }
          }
          else {
            std::__cxx11::string::operator=((string *)__return_storage_ptr__,location);
          }
          std::__cxx11::string::~string((string *)local_a8);
        }
        else {
          std::__cxx11::string::operator=((string *)__return_storage_ptr__,imp);
        }
      }
      else if (desired_config.field_2._12_4_ == 1) {
        if (suffix.field_2._8_8_ == 0) {
          TVar2 = GetType(this);
          if ((TVar2 == SHARED_LIBRARY) || (bVar1 = IsExecutableWithExports(this), bVar1)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_108,"IMPORTED_IMPLIB",(allocator *)((long)&config_implib + 7)
                      );
            std::allocator<char>::~allocator((allocator<char> *)((long)&config_implib + 7));
            std::__cxx11::string::operator+=
                      ((string *)local_108,(string *)(impProp.field_2._M_local_buf + 8));
            implib = GetProperty(this,(string *)local_108);
            if (implib == (char *)0x0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_140,"IMPORTED_IMPLIB",&local_141);
              pcVar4 = GetProperty(this,&local_140);
              std::__cxx11::string::~string((string *)&local_140);
              std::allocator<char>::~allocator((allocator<char> *)&local_141);
              local_120 = pcVar4;
              if (pcVar4 != (char *)0x0) {
                std::__cxx11::string::operator=((string *)__return_storage_ptr__,pcVar4);
              }
            }
            else {
              std::__cxx11::string::operator=((string *)__return_storage_ptr__,implib);
            }
            std::__cxx11::string::~string((string *)local_108);
          }
        }
        else {
          std::__cxx11::string::operator=
                    ((string *)__return_storage_ptr__,(char *)suffix.field_2._8_8_);
        }
      }
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      psVar5 = GetName_abi_cxx11_(this);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)psVar5);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"-NOTFOUND");
    }
    loc._3_1_ = 1;
    std::__cxx11::string::~string((string *)(impProp.field_2._M_local_buf + 8));
    if ((loc._3_1_ & 1) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)local_48);
    return __return_storage_ptr__;
  }
  __assert_fail("this->IsImported()",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmTarget.cxx"
                ,0x56e,
                "std::string cmTarget::ImportedGetFullPath(const std::string &, cmStateEnums::ArtifactType) const"
               );
}

Assistant:

std::string cmTarget::ImportedGetFullPath(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  assert(this->IsImported());

  // Lookup/compute/cache the import information for this
  // configuration.
  std::string desired_config = config;
  if (config.empty()) {
    desired_config = "NOCONFIG";
  }

  std::string result;

  const char* loc = CM_NULLPTR;
  const char* imp = CM_NULLPTR;
  std::string suffix;

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetMappedConfig(desired_config, &loc, &imp, suffix)) {
    switch (artifact) {
      case cmStateEnums::RuntimeBinaryArtifact:
        if (loc) {
          result = loc;
        } else {
          std::string impProp = "IMPORTED_LOCATION";
          impProp += suffix;
          if (const char* config_location = this->GetProperty(impProp)) {
            result = config_location;
          } else if (const char* location =
                       this->GetProperty("IMPORTED_LOCATION")) {
            result = location;
          }
        }
        break;

      case cmStateEnums::ImportLibraryArtifact:
        if (imp) {
          result = imp;
        } else if (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
                   this->IsExecutableWithExports()) {
          std::string impProp = "IMPORTED_IMPLIB";
          impProp += suffix;
          if (const char* config_implib = this->GetProperty(impProp)) {
            result = config_implib;
          } else if (const char* implib =
                       this->GetProperty("IMPORTED_IMPLIB")) {
            result = implib;
          }
        }
        break;
    }
  }

  if (result.empty()) {
    result = this->GetName();
    result += "-NOTFOUND";
  }
  return result;
}